

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Body.h
# Opt level: O0

Body * __thiscall RigidBodyDynamics::Body::operator=(Body *this,Body *body)

{
  Body *in_RSI;
  Body *in_RDI;
  
  if (in_RDI != in_RSI) {
    in_RDI->mMass = in_RSI->mMass;
    Matrix3_t::operator=((Matrix3_t *)in_RSI,(Matrix3_t *)in_RDI);
    Vector3_t::operator=((Vector3_t *)in_RSI,(Vector3_t *)in_RDI);
    in_RDI->mIsVirtual = (bool)(in_RSI->mIsVirtual & 1);
  }
  return in_RDI;
}

Assistant:

Body& operator= (const Body &body) {
		if (this != &body) {
			mMass = body.mMass;
			mInertia = body.mInertia;
			mCenterOfMass = body.mCenterOfMass;
			mIsVirtual = body.mIsVirtual;
		}

		return *this;
	}